

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

uint8_t m256v_LU_det(m256v *LU)

{
  uint8_t uVar1;
  long in_RDI;
  int i;
  uint8_t det;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int iVar2;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(1,in_stack_fffffffffffffff4);
  for (iVar2 = 0; uVar1 = (uint8_t)((uint)uVar3 >> 0x18), iVar2 < *(int *)(in_RDI + 4);
      iVar2 = iVar2 + 1) {
    in_stack_ffffffffffffffec = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffec);
    m256v_get_el((m256v *)CONCAT44(uVar3,iVar2),in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
    ;
    uVar1 = gf256_mul('\0','\0');
    uVar3 = CONCAT13(uVar1,(int3)uVar3);
  }
  return uVar1;
}

Assistant:

MV_GEN_ELTYPE MV_GEN_N(_LU_det)(const MV_GEN_TYPE* LU)
{
	assert(LU->n_row == LU->n_col);

	MV_GEN_ELTYPE det = 1;
	for (int i = 0; i < LU->n_col; ++i) {
		det = fmul(det, MV_GEN_N(_get_el)(LU, i, i));
	}

	return det;
}